

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Value(char *prefix,float v,char *float_format)

{
  long in_RSI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  char fmt [64];
  char acStack_58 [76];
  float local_c;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    Text((char *)(double)in_XMM0_Da,"%s: %.3f",in_RDI);
  }
  else {
    local_c = in_XMM0_Da;
    local_8 = in_RDI;
    ImFormatString(acStack_58,0x40,"%%s: %s",in_RSI);
    Text((char *)(double)local_c,acStack_58,local_8);
  }
  return;
}

Assistant:

void ImGui::Value(const char* prefix, float v, const char* float_format)
{
    if (float_format)
    {
        char fmt[64];
        ImFormatString(fmt, IM_ARRAYSIZE(fmt), "%%s: %s", float_format);
        Text(fmt, prefix, v);
    }
    else
    {
        Text("%s: %.3f", prefix, v);
    }
}